

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

QRect __thiscall QProxyStyle::itemPixmapRect(QProxyStyle *this,QRect *r,int flags,QPixmap *pixmap)

{
  QRect QVar1;
  QProxyStylePrivate *pQVar2;
  QStyle *pQVar3;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  QProxyStylePrivate *d;
  QProxyStylePrivate *in_stack_fffffffffffffff8;
  
  pQVar2 = d_func((QProxyStyle *)0x409325);
  QProxyStylePrivate::ensureBaseStyle(in_stack_fffffffffffffff8);
  pQVar3 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x409342);
  QVar1 = (QRect)(**(code **)(*(long *)pQVar3 + 0x90))
                           (pQVar3,in_RSI,in_EDX,in_RCX,in_R8,in_R9,pQVar2);
  return QVar1;
}

Assistant:

QRect QProxyStyle::itemPixmapRect(const QRect &r, int flags, const QPixmap &pixmap) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->itemPixmapRect(r, flags, pixmap);
}